

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O2

void CVmPack::skip_group(CVmPackPos *p,wchar_t close_paren)

{
  int iVar1;
  wchar_t wVar2;
  int iVar3;
  
  iVar3 = 1;
  do {
    CVmPackPos::inc(p);
    iVar1 = CVmPackPos::more(p);
    if (iVar1 == 0) break;
    wVar2 = CVmPackPos::getch(p);
    if (wVar2 == L'(') {
LAB_00268295:
      iVar3 = iVar3 + 1;
    }
    else if (wVar2 == L')') {
LAB_0026829a:
      iVar3 = iVar3 + -1;
    }
    else {
      if (wVar2 == L'[') goto LAB_00268295;
      if ((wVar2 == L']') || (wVar2 == L'}')) goto LAB_0026829a;
      if (wVar2 == L'{') goto LAB_00268295;
    }
  } while (wVar2 != close_paren || iVar3 != 0);
  iVar3 = CVmPackPos::more(p);
  if (iVar3 != 0) {
    return;
  }
  err_throw_a(0x6b,1,0,(ulong)(uint)p->idx);
}

Assistant:

void CVmPack::skip_group(CVmPackPos *p, wchar_t close_paren)
{
    /* scan ahead to the matching close paren */
    int depth = 1;
    for (p->inc() ; p->more() ; p->inc())
    {
        /* note any further nesting */
        wchar_t c = p->getch();
        switch (c)
        {
        case '(':
        case '[':
        case '{':
            depth++;
            break;

        case ')':
        case ']':
        case '}':
            depth--;
            break;
        }

        /* 
         *   if this is our close paren, and we're not in nested parens or
         *   other brackets, we're done 
         */
        if (c == close_paren && depth == 0)
            break;
    }

    /* make sure we found the matching close paren */
    if (!p->more())
        err_throw_a(VMERR_PACK_PARSE, 1, ERR_TYPE_INT, p->index());
}